

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_fullname(char *path,size_t path_size,char *name,size_t name_size)

{
  bool bVar1;
  size_t count;
  size_t i;
  size_t name_size_local;
  char *name_local;
  size_t path_size_local;
  char *path_local;
  size_t local_8;
  
  if ((path == (char *)0x0) || (name == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    i = 0;
    count = 0;
    while( true ) {
      bVar1 = false;
      if ((path[i] != '\0') && (bVar1 = false, i < path_size)) {
        bVar1 = count < name_size;
      }
      if (!bVar1) break;
      name[count] = path[i];
      count = count + 1;
      if (path[i] == '/') {
        count = 0;
      }
      i = i + 1;
    }
    name[count] = '\0';
    local_8 = count + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_fullname(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
	}

	name[count] = '\0';

	return count + 1;
}